

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Utils.c
# Opt level: O2

int XCountUtf8Char(uchar *buf,int len)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  for (uVar3 = 0; len - uVar3 != 0 && (int)uVar3 <= len; uVar3 = uVar3 + iVar1) {
    iVar1 = XUtf8CharByteLen(buf + uVar3,len - uVar3);
    if (iVar1 < 2) {
      iVar1 = 1;
    }
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int 
XCountUtf8Char(const unsigned char 	*buf, 
	       int 			len) {

  int i = 0;
  int nbc = 0;
  while (i < len) {
    int cl = XUtf8CharByteLen(buf + i, len - i);
    if (cl < 1) cl = 1;
    nbc++;
    i += cl;
  }
  return nbc;
}